

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

RtreeNode * rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur,int *pRC)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  long in_RDI;
  RtreeNode **unaff_retaddr;
  RtreeNode *in_stack_00000008;
  int ii;
  sqlite3_int64 id;
  
  iVar1 = 1 - (uint)*(byte *)(in_RDI + 9);
  if (*(long *)(in_RDI + 0x58 + (long)iVar1 * 8) == 0) {
    iVar2 = nodeAcquire((Rtree *)pRC,id,in_stack_00000008,unaff_retaddr);
    *in_RSI = iVar2;
  }
  return *(RtreeNode **)(in_RDI + 0x58 + (long)iVar1 * 8);
}

Assistant:

static RtreeNode *rtreeNodeOfFirstSearchPoint(RtreeCursor *pCur, int *pRC){
  sqlite3_int64 id;
  int ii = 1 - pCur->bPoint;
  assert( ii==0 || ii==1 );
  assert( pCur->bPoint || pCur->nPoint );
  if( pCur->aNode[ii]==0 ){
    assert( pRC!=0 );
    id = ii ? pCur->aPoint[0].id : pCur->sPoint.id;
    *pRC = nodeAcquire(RTREE_OF_CURSOR(pCur), id, 0, &pCur->aNode[ii]);
  }
  return pCur->aNode[ii];
}